

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

Time __thiscall helics::FederateState::nextMessageTime(FederateState *this)

{
  bool bVar1;
  const_iterator __lhs;
  EndpointInfo *in_RDI;
  Time messageTime;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *endpoint;
  const_iterator __end1;
  const_iterator __begin1;
  shared_handle *__range1;
  TimeRepresentation<count_time<9,_long>_> firstMessageTime;
  Time in_stack_ffffffffffffff78;
  TimeRepresentation<count_time<9,_long>_> local_60;
  reference local_58;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *local_50;
  __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
  local_38;
  undefined1 local_30 [24];
  undefined1 *local_18;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = 0x7fffffffffffffff;
  InterfaceInfo::getEndpoints_abi_cxx11_
            ((InterfaceInfo *)in_stack_ffffffffffffff78.internalTimeCode);
  local_18 = local_30;
  local_38._M_current =
       (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
       gmlc::libguarded::
       shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
       ::begin((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)in_stack_ffffffffffffff78.internalTimeCode);
  __lhs = gmlc::libguarded::
          shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::end((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                 *)in_stack_ffffffffffffff78.internalTimeCode);
  local_50 = (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)__lhs;
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)__lhs._M_current,
                            (__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)in_stack_ffffffffffffff78.internalTimeCode),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
               ::operator*(&local_38);
    std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::operator->
              ((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
               0x580da5);
    in_stack_ffffffffffffff78 = EndpointInfo::firstMessageTime(in_RDI);
    local_60.internalTimeCode = in_stack_ffffffffffffff78.internalTimeCode;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (&local_60,
                       (TimeRepresentation<count_time<9,_long>_> *)
                       ((long)&in_RDI[3].message_queue.m_mutex._M_impl._M_rwlock + 0x20));
    if (bVar1) {
      local_60.internalTimeCode =
           *(baseType *)((long)&in_RDI[3].message_queue.m_mutex._M_impl._M_rwlock + 0x20);
    }
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_60,&local_8);
    if (bVar1) {
      local_8.internalTimeCode = local_60.internalTimeCode;
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator++(&local_38);
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              *)0x580d6a);
  return (Time)local_8.internalTimeCode;
}

Assistant:

Time FederateState::nextMessageTime() const
{
    auto firstMessageTime = Time::maxVal();
    for (const auto& endpoint : interfaceInformation.getEndpoints()) {
        auto messageTime = endpoint->firstMessageTime();
        if (messageTime < time_granted) {
            messageTime = time_granted;
        }
        if (messageTime < firstMessageTime) {
            firstMessageTime = messageTime;
        }
    }
    return firstMessageTime;
}